

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::Node::Node(Node *this,string *name)

{
  string *in_RSI;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffcc;
  RefCount *in_stack_ffffffffffffffd0;
  
  RefCount::RefCount(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  *in_RDI = &PTR__Node_00647e30;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RSI);
  in_RDI[10] = 0;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0xffffffff;
  in_RDI[0xc] = 0;
  return;
}

Assistant:

Node (const std::string& name) 
        : name(name), indegree(0), closed(false), id(-1), geometry(nullptr) {}